

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.hpp
# Opt level: O2

void __thiscall
Indexing::AlascaIndex<Inferences::ALASCA::BinaryResolutionConf::Lhs>::handleClause
          (AlascaIndex<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,Clause *c,bool adding)

{
  StlIter __begin0;
  Elem appl;
  StlIter local_1e0;
  SelectedLiteral local_1a0;
  SelectedLiteral local_170;
  SelectedLiteral local_140;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:249:17),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:61:22),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_BinaryResolution_hpp:62:19),_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  local_110;
  
  Inferences::ALASCA::BinaryResolutionConf::Lhs::iter
            (&local_110,
             (this->_shared).super___shared_ptr<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,c);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:249:17),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:61:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:62:19),_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  ::StlIter::StlIter(&local_1e0,&local_110);
  while (local_1e0._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs>._isSome !=
         false) {
    Kernel::SelectedLiteral::SelectedLiteral
              (&local_140,
               (SelectedLiteral *)
               &local_1e0._cur.super_OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs>._elem
              );
    if (adding) {
      Kernel::SelectedLiteral::SelectedLiteral(&local_170,&local_140);
      LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Lhs>::insert
                (&(this->_index).
                  super_LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Lhs>,
                 (LeafData *)&local_170);
    }
    else {
      Kernel::SelectedLiteral::SelectedLiteral(&local_1a0,&local_140);
      LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Lhs>::remove
                (&(this->_index).
                  super_LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Lhs>,
                 (char *)&local_1a0);
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:249:17),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:61:22),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/BinaryResolution.hpp:62:19),_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    ::StlIter::operator++(&local_1e0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_110._iter._inner._inn._inn._inner + 0x10));
  return;
}

Assistant:

virtual void handleClause(Clause* c, bool adding) final override
  {
    TIME_TRACE(_maintainanceStr.c_str())
    for (auto appl : T::iter(*_shared, c)) {
      if (adding) {
#if VDEBUG
        auto k = appl.key();
#endif
        _index.insert(std::move(appl));
        DEBUG_CODE(
        auto state = AbstractingUnifier::empty(AbstractionOracle(Shell::Options::UnificationWithAbstraction::OFF));
        )
        ASS_REP(find<RetrievalAlgorithms::DefaultVarBanks>(&state, k).hasNext(), Output::cat("key: ", Output::ptr(k), "\nindex: ", Output::multiline(_index)))
      } else {
        _index.remove(std::move(appl));
      }
    }
  }